

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  char cVar24;
  byte bVar25;
  bool bVar26;
  ulong uVar27;
  ulong *puVar28;
  long lVar29;
  NodeRef root;
  uint uVar30;
  undefined1 (*pauVar31) [32];
  undefined4 uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar37 [16];
  int iVar36;
  int iVar51;
  int iVar52;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar38 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar53;
  int iVar57;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 in_ZMM1 [64];
  undefined1 auVar65 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 in_ZMM4 [64];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  vfloat4 a0;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_29e4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar44 = *(undefined1 (*) [32])(ray + 0x100);
    auVar40 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar34 = vcmpps_avx512vl(auVar44,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar27 = vpcmpeqd_avx512vl(auVar40,(undefined1  [32])valid_i->field_0);
    uVar34 = uVar34 & uVar27;
    bVar33 = (byte)uVar34;
    if (bVar33 != 0) {
      local_2920 = *(undefined1 (*) [32])(ray + 0x80);
      local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar84._0_4_ = local_28e0._0_4_ * local_28e0._0_4_;
      auVar84._4_4_ = local_28e0._4_4_ * local_28e0._4_4_;
      auVar84._8_4_ = local_28e0._8_4_ * local_28e0._8_4_;
      auVar84._12_4_ = local_28e0._12_4_ * local_28e0._12_4_;
      auVar84._16_4_ = local_28e0._16_4_ * local_28e0._16_4_;
      auVar84._20_4_ = local_28e0._20_4_ * local_28e0._20_4_;
      auVar84._28_36_ = in_ZMM4._28_36_;
      auVar84._24_4_ = local_28e0._24_4_ * local_28e0._24_4_;
      auVar81 = vfmadd231ps_fma(auVar84._0_32_,local_2900,local_2900);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2920,local_2920);
      auVar39 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar40._8_4_ = 0xbf000000;
      auVar40._0_8_ = 0xbf000000bf000000;
      auVar40._12_4_ = 0xbf000000;
      auVar40._16_4_ = 0xbf000000;
      auVar40._20_4_ = 0xbf000000;
      auVar40._24_4_ = 0xbf000000;
      auVar40._28_4_ = 0xbf000000;
      auVar40 = vmulps_avx512vl(ZEXT1632(auVar81),auVar40);
      fVar78 = auVar39._0_4_;
      fVar58 = auVar39._4_4_;
      fVar66 = auVar39._8_4_;
      fVar67 = auVar39._12_4_;
      fVar68 = auVar39._16_4_;
      fVar69 = auVar39._20_4_;
      fVar70 = auVar39._24_4_;
      auVar81._0_4_ = fVar78 * fVar78;
      auVar81._4_4_ = fVar58 * fVar58;
      auVar81._8_4_ = fVar66 * fVar66;
      auVar81._12_4_ = fVar67 * fVar67;
      auVar42._4_4_ = auVar81._4_4_ * fVar58 * auVar40._4_4_;
      auVar42._0_4_ = auVar81._0_4_ * fVar78 * auVar40._0_4_;
      auVar42._8_4_ = auVar81._8_4_ * fVar66 * auVar40._8_4_;
      auVar42._12_4_ = auVar81._12_4_ * fVar67 * auVar40._12_4_;
      auVar42._16_4_ = fVar68 * fVar68 * fVar68 * auVar40._16_4_;
      auVar42._20_4_ = fVar69 * fVar69 * fVar69 * auVar40._20_4_;
      auVar42._24_4_ = fVar70 * fVar70 * fVar70 * auVar40._24_4_;
      auVar42._28_4_ = auVar40._28_4_;
      auVar41._8_4_ = 0x3fc00000;
      auVar41._0_8_ = 0x3fc000003fc00000;
      auVar41._12_4_ = 0x3fc00000;
      auVar41._16_4_ = 0x3fc00000;
      auVar41._20_4_ = 0x3fc00000;
      auVar41._24_4_ = 0x3fc00000;
      auVar41._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar42,auVar39,auVar41);
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar79._12_4_ = 0;
      auVar79._0_12_ = ZEXT812(0);
      auVar79 = auVar79 << 0x20;
      auVar81 = vpcmpeqd_avx(auVar81,auVar81);
      auVar84 = ZEXT1664(auVar81);
      auVar87 = ZEXT464(0x3f000000);
      uVar27 = uVar34;
      do {
        lVar29 = 0;
        for (uVar35 = uVar27; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar29 = lVar29 + 1;
        }
        uVar35 = (ulong)(uint)((int)lVar29 * 4);
        auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar35 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar35 + 0xa0)),0x1c);
        fVar78 = *(float *)((long)&local_27c0 + uVar35);
        auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + uVar35 + 0xc0)),0x28);
        auVar88._0_4_ = auVar37._0_4_ * fVar78;
        auVar88._4_4_ = auVar37._4_4_ * fVar78;
        auVar88._8_4_ = auVar37._8_4_ * fVar78;
        auVar88._12_4_ = auVar37._12_4_ * fVar78;
        auVar37 = vshufpd_avx(auVar88,auVar88,1);
        auVar89 = vmovshdup_avx(auVar88);
        auVar93 = vunpckhps_avx(auVar88,auVar79);
        auVar38._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar38._8_8_ = auVar37._8_8_ ^ auVar75._8_8_;
        auVar38 = vinsertps_avx(auVar38,auVar88,0x2a);
        auVar37 = vdpps_avx(auVar38,auVar38,0x7f);
        auVar93 = vshufps_avx(auVar93,ZEXT416(auVar89._0_4_ ^ 0x80000000),0x41);
        auVar89 = vdpps_avx(auVar93,auVar93,0x7f);
        uVar11 = vcmpps_avx512vl(auVar37,auVar89,1);
        auVar37 = vpmovm2d_avx512vl(uVar11);
        auVar96._0_4_ = auVar37._0_4_;
        auVar96._4_4_ = auVar96._0_4_;
        auVar96._8_4_ = auVar96._0_4_;
        auVar96._12_4_ = auVar96._0_4_;
        uVar35 = vpmovd2m_avx512vl(auVar96);
        auVar37._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * auVar81._4_4_;
        auVar37._0_4_ = (uint)((byte)uVar35 & 1) * auVar81._0_4_;
        auVar37._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * auVar81._8_4_;
        auVar37._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * auVar81._12_4_;
        auVar37 = vblendvps_avx(auVar38,auVar93,auVar37);
        auVar89 = vdpps_avx(auVar37,auVar37,0x7f);
        auVar38 = vrsqrt14ss_avx512f(auVar79,ZEXT416((uint)auVar89._0_4_));
        fVar58 = auVar38._0_4_;
        fVar58 = fVar58 * 1.5 - auVar89._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
        auVar93._0_4_ = auVar37._0_4_ * fVar58;
        auVar93._4_4_ = auVar37._4_4_ * fVar58;
        auVar93._8_4_ = auVar37._8_4_ * fVar58;
        auVar93._12_4_ = auVar37._12_4_ * fVar58;
        auVar37 = vshufps_avx(auVar93,auVar93,0xc9);
        auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar97._0_4_ = auVar93._0_4_ * auVar89._0_4_;
        auVar97._4_4_ = auVar93._4_4_ * auVar89._4_4_;
        auVar97._8_4_ = auVar93._8_4_ * auVar89._8_4_;
        auVar97._12_4_ = auVar93._12_4_ * auVar89._12_4_;
        auVar37 = vfmsub231ps_fma(auVar97,auVar88,auVar37);
        lVar29 = lVar29 * 0x30;
        auVar89 = vshufps_avx(auVar37,auVar37,0xc9);
        auVar37 = vdpps_avx(auVar89,auVar89,0x7f);
        uVar27 = uVar27 - 1 & uVar27;
        auVar38 = vrsqrt14ss_avx512f(auVar79,ZEXT416((uint)auVar37._0_4_));
        fVar58 = auVar38._0_4_;
        fVar58 = fVar58 * 1.5 - auVar37._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
        auVar94._0_4_ = fVar58 * auVar89._0_4_;
        auVar94._4_4_ = fVar58 * auVar89._4_4_;
        auVar94._8_4_ = fVar58 * auVar89._8_4_;
        auVar94._12_4_ = fVar58 * auVar89._12_4_;
        auVar89._0_4_ = fVar78 * auVar88._0_4_;
        auVar89._4_4_ = fVar78 * auVar88._4_4_;
        auVar89._8_4_ = fVar78 * auVar88._8_4_;
        auVar89._12_4_ = fVar78 * auVar88._12_4_;
        auVar38 = vunpcklps_avx(auVar93,auVar89);
        auVar37 = vunpckhps_avx(auVar93,auVar89);
        auVar93 = vunpcklps_avx(auVar94,auVar79);
        auVar89 = vunpckhps_avx(auVar94,auVar79);
        auVar89 = vunpcklps_avx(auVar37,auVar89);
        auVar90 = ZEXT1664(auVar89);
        auVar88 = vunpcklps_avx(auVar38,auVar93);
        auVar37 = vunpckhps_avx(auVar38,auVar93);
        auVar92 = ZEXT1664(auVar37);
        *(undefined1 (*) [16])(local_27a0 + lVar29) = auVar88;
        *(undefined1 (*) [16])(auStack_2790 + lVar29) = auVar37;
        *(undefined1 (*) [16])(auStack_2780 + lVar29) = auVar89;
      } while (uVar27 != 0);
      local_2980._0_8_ = *(undefined8 *)ray;
      local_2980._8_8_ = *(undefined8 *)(ray + 8);
      local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar99 = ZEXT3264(auVar40);
      vandps_avx512vl(local_2920,auVar40);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar100 = ZEXT3264(auVar41);
      uVar27 = vcmpps_avx512vl(auVar40,auVar41,1);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar101 = ZEXT3264(auVar42);
      auVar39 = vdivps_avx512vl(auVar42,local_2920);
      vandps_avx512vl(local_2900,auVar40);
      uVar35 = vcmpps_avx512vl(auVar39,auVar41,1);
      auVar43 = vdivps_avx512vl(auVar42,local_2900);
      vandps_avx512vl(_local_28e0,auVar40);
      uVar12 = vcmpps_avx512vl(auVar43,auVar41,1);
      auVar40 = vdivps_avx512vl(auVar42,_local_28e0);
      bVar26 = (bool)((byte)uVar27 & 1);
      local_28c0._0_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._0_4_;
      bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
      local_28c0._4_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._4_4_;
      bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
      fStack_28b8 = (float)((uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._8_4_);
      bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
      fStack_28b4 = (float)((uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._12_4_);
      bVar26 = (bool)((byte)(uVar27 >> 4) & 1);
      fStack_28b0 = (float)((uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._16_4_);
      bVar26 = (bool)((byte)(uVar27 >> 5) & 1);
      fStack_28ac = (float)((uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._20_4_);
      bVar26 = (bool)((byte)(uVar27 >> 6) & 1);
      fStack_28a8 = (float)((uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._24_4_);
      bVar26 = SUB81(uVar27 >> 7,0);
      uStack_28a4 = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar39._28_4_;
      bVar26 = (bool)((byte)uVar35 & 1);
      local_28a0._0_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._0_4_;
      bVar26 = (bool)((byte)(uVar35 >> 1) & 1);
      local_28a0._4_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._4_4_;
      bVar26 = (bool)((byte)(uVar35 >> 2) & 1);
      local_28a0._8_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._8_4_;
      bVar26 = (bool)((byte)(uVar35 >> 3) & 1);
      local_28a0._12_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._12_4_;
      bVar26 = (bool)((byte)(uVar35 >> 4) & 1);
      local_28a0._16_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._16_4_;
      bVar26 = (bool)((byte)(uVar35 >> 5) & 1);
      local_28a0._20_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._20_4_;
      bVar26 = (bool)((byte)(uVar35 >> 6) & 1);
      local_28a0._24_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._24_4_;
      bVar26 = SUB81(uVar35 >> 7,0);
      local_28a0._28_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar43._28_4_;
      bVar26 = (bool)((byte)uVar12 & 1);
      local_2880._0_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._0_4_;
      bVar26 = (bool)((byte)(uVar12 >> 1) & 1);
      local_2880._4_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._4_4_;
      bVar26 = (bool)((byte)(uVar12 >> 2) & 1);
      local_2880._8_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._8_4_;
      bVar26 = (bool)((byte)(uVar12 >> 3) & 1);
      local_2880._12_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._12_4_;
      bVar26 = (bool)((byte)(uVar12 >> 4) & 1);
      local_2880._16_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._16_4_;
      bVar26 = (bool)((byte)(uVar12 >> 5) & 1);
      local_2880._20_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._20_4_;
      bVar26 = (bool)((byte)(uVar12 >> 6) & 1);
      local_2880._24_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._24_4_;
      bVar26 = SUB81(uVar12 >> 7,0);
      local_2880._28_4_ = (uint)bVar26 * 0x5d5e0b6b | (uint)!bVar26 * auVar40._28_4_;
      uVar27 = vcmpps_avx512vl(_local_28c0,ZEXT832(0) << 0x20,1);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar27 >> 1) & 1) * auVar40._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar27 & 1) * auVar40._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar27 >> 2) & 1) * auVar40._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar27 >> 3) & 1) * auVar40._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * auVar40._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * auVar40._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * auVar40._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar27 >> 7) * auVar40._28_4_;
      uVar27 = vcmpps_avx512vl(local_28a0,ZEXT832(0) << 0x20,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar26 = (bool)((byte)uVar27 & 1);
      local_2840 = (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
      uStack_283c = (uint)bVar26 * auVar40._4_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
      uStack_2838 = (uint)bVar26 * auVar40._8_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
      uStack_2834 = (uint)bVar26 * auVar40._12_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 4) & 1);
      uStack_2830 = (uint)bVar26 * auVar40._16_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 5) & 1);
      uStack_282c = (uint)bVar26 * auVar40._20_4_ | (uint)!bVar26 * 0x30;
      bVar26 = (bool)((byte)(uVar27 >> 6) & 1);
      uStack_2828 = (uint)bVar26 * auVar40._24_4_ | (uint)!bVar26 * 0x30;
      bVar26 = SUB81(uVar27 >> 7,0);
      uStack_2824 = (uint)bVar26 * auVar40._28_4_ | (uint)!bVar26 * 0x30;
      auVar41 = ZEXT832(0) << 0x20;
      uVar27 = vcmpps_avx512vl(local_2880,auVar41,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar26 = (bool)((byte)uVar27 & 1);
      local_2820 = (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 1) & 1);
      uStack_281c = (uint)bVar26 * auVar40._4_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 2) & 1);
      uStack_2818 = (uint)bVar26 * auVar40._8_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 3) & 1);
      uStack_2814 = (uint)bVar26 * auVar40._12_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 4) & 1);
      uStack_2810 = (uint)bVar26 * auVar40._16_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 5) & 1);
      uStack_280c = (uint)bVar26 * auVar40._20_4_ | (uint)!bVar26 * 0x50;
      bVar26 = (bool)((byte)(uVar27 >> 6) & 1);
      uStack_2808 = (uint)bVar26 * auVar40._24_4_ | (uint)!bVar26 * 0x50;
      bVar26 = SUB81(uVar27 >> 7,0);
      uStack_2804 = (uint)bVar26 * auVar40._28_4_ | (uint)!bVar26 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = ZEXT3264(local_1e80);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar41);
      local_2800 = (uint)(bVar33 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar33 & 1) * local_1e80._0_4_
      ;
      bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
      uStack_27fc = (uint)bVar26 * auVar40._4_4_ | (uint)!bVar26 * local_1e80._4_4_;
      bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
      uStack_27f8 = (uint)bVar26 * auVar40._8_4_ | (uint)!bVar26 * local_1e80._8_4_;
      bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
      uStack_27f4 = (uint)bVar26 * auVar40._12_4_ | (uint)!bVar26 * local_1e80._12_4_;
      bVar26 = (bool)((byte)(uVar34 >> 4) & 1);
      uStack_27f0 = (uint)bVar26 * auVar40._16_4_ | (uint)!bVar26 * local_1e80._16_4_;
      bVar26 = (bool)((byte)(uVar34 >> 5) & 1);
      uStack_27ec = (uint)bVar26 * auVar40._20_4_ | (uint)!bVar26 * local_1e80._20_4_;
      bVar26 = (bool)((byte)(uVar34 >> 6) & 1);
      uStack_27e8 = (uint)bVar26 * auVar40._24_4_ | (uint)!bVar26 * local_1e80._24_4_;
      bVar26 = SUB81(uVar34 >> 7,0);
      uStack_27e4 = (uint)bVar26 * auVar40._28_4_ | (uint)!bVar26 * local_1e80._28_4_;
      auVar44 = vmaxps_avx512vl(auVar44,auVar41);
      local_27e0._0_4_ = (uint)(bVar33 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar33 & 1) * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar26 * auVar44._4_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar26 * auVar44._8_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar26 * auVar44._12_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar26 * auVar44._16_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar26 * auVar44._20_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = (bool)((byte)(uVar34 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar26 * auVar44._24_4_ | (uint)!bVar26 * -0x800000;
      bVar26 = SUB81(uVar34 >> 7,0);
      local_27e0._28_4_ = (uint)bVar26 * auVar44._28_4_ | (uint)!bVar26 * -0x800000;
      local_29e4 = ~bVar33;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 5;
      }
      else {
        uVar30 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar28 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar31 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar2;
      local_1e60 = local_2800;
      uStack_1e5c = uStack_27fc;
      uStack_1e58 = uStack_27f8;
      uStack_1e54 = uStack_27f4;
      uStack_1e50 = uStack_27f0;
      uStack_1e4c = uStack_27ec;
      uStack_1e48 = uStack_27e8;
      uStack_1e44 = uStack_27e4;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar103 = ZEXT3264(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar104 = ZEXT3264(auVar44);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar106 = ZEXT3264(auVar44);
LAB_0070e661:
      do {
        do {
          root.ptr = puVar28[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0070ec6b;
          puVar28 = puVar28 + -1;
          auVar44 = pauVar31[-1];
          auVar65 = ZEXT3264(auVar44);
          pauVar31 = pauVar31 + -1;
          uVar34 = vcmpps_avx512vl(auVar44,local_27e0,1);
        } while ((char)uVar34 == '\0');
        uVar32 = (undefined4)uVar34;
        if (uVar30 < (uint)POPCOUNT(uVar32)) {
LAB_0070e6a0:
          do {
            lVar29 = 0x1c;
            uVar34 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0070ec6b;
              uVar11 = vcmpps_avx512vl(auVar65._0_32_,local_27e0,9);
              if ((char)uVar11 != '\0') {
                if (local_29e4 == 0xff) {
                  bVar25 = 0;
                }
                else {
                  uVar34 = (ulong)(byte)~local_29e4;
                  bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar3 = This->leafIntersector;
                  bVar25 = 0;
                  do {
                    lVar29 = 0;
                    for (uVar27 = uVar34; (uVar27 & 1) == 0;
                        uVar27 = uVar27 >> 1 | 0x8000000000000000) {
                      lVar29 = lVar29 + 1;
                    }
                    auVar84 = ZEXT1664(auVar84._0_16_);
                    auVar87 = ZEXT1664(auVar87._0_16_);
                    auVar90 = ZEXT1664(auVar90._0_16_);
                    auVar92 = ZEXT1664(auVar92._0_16_);
                    cVar24 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                       (&local_27c0,ray,lVar29,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    bVar16 = (byte)(1 << ((uint)lVar29 & 0x1f));
                    if (cVar24 == '\0') {
                      bVar16 = 0;
                    }
                    bVar25 = bVar25 | bVar16;
                    uVar34 = uVar34 - 1 & uVar34;
                  } while (uVar34 != 0);
                }
                local_29e4 = local_29e4 | bVar25;
                if (local_29e4 == 0xff) {
                  local_29e4 = 0xff;
                  goto LAB_0070ec6b;
                }
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar26 = (bool)(local_29e4 >> 1 & 1);
                bVar4 = (bool)(local_29e4 >> 2 & 1);
                bVar5 = (bool)(local_29e4 >> 3 & 1);
                bVar6 = (bool)(local_29e4 >> 4 & 1);
                bVar7 = (bool)(local_29e4 >> 5 & 1);
                bVar8 = (bool)(local_29e4 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar26 * auVar44._4_4_ | (uint)!bVar26 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(local_29e4 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(local_29e4 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar4 * auVar44._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar5 * auVar44._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar6 * auVar44._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar8 * auVar44._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(local_29e4 >> 7) * auVar44._28_4_ |
                     (uint)!(bool)(local_29e4 >> 7) * local_27e0._28_4_;
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar99 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar100 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar101 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar102 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar103 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar104 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar106 = ZEXT3264(auVar44);
              }
              goto LAB_0070e661;
            }
            uVar27 = root.ptr & 0xfffffffffffffff0;
            auVar44 = auVar102._0_32_;
            do {
              uVar35 = *(ulong *)((uVar27 - 0xe0) + lVar29 * 8);
              if (uVar35 == 8) {
                auVar65 = ZEXT3264(auVar44);
                break;
              }
              auVar65._28_36_ = auVar84._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar32 = *(undefined4 *)((root.ptr - 0x50) + lVar29 * 4);
                auVar59._4_4_ = uVar32;
                auVar59._0_4_ = uVar32;
                auVar59._8_4_ = uVar32;
                auVar59._12_4_ = uVar32;
                auVar59._16_4_ = uVar32;
                auVar59._20_4_ = uVar32;
                auVar59._24_4_ = uVar32;
                auVar59._28_4_ = uVar32;
                auVar17._8_8_ = local_2980._8_8_;
                auVar17._0_8_ = local_2980._0_8_;
                auVar17._16_8_ = local_2980._16_8_;
                auVar17._24_8_ = local_2980._24_8_;
                auVar19._8_8_ = local_2980._40_8_;
                auVar19._0_8_ = local_2980._32_8_;
                auVar19._16_8_ = local_2980._48_8_;
                auVar19._24_8_ = local_2980._56_8_;
                auVar21._8_8_ = local_2980._72_8_;
                auVar21._0_8_ = local_2980._64_8_;
                auVar21._16_8_ = local_2980._80_8_;
                auVar21._24_8_ = local_2980._88_8_;
                auVar40 = vsubps_avx(auVar59,auVar17);
                auVar65._0_4_ = (float)local_28c0._0_4_ * auVar40._0_4_;
                auVar65._4_4_ = (float)local_28c0._4_4_ * auVar40._4_4_;
                auVar65._8_4_ = fStack_28b8 * auVar40._8_4_;
                auVar65._12_4_ = fStack_28b4 * auVar40._12_4_;
                auVar65._16_4_ = fStack_28b0 * auVar40._16_4_;
                auVar65._20_4_ = fStack_28ac * auVar40._20_4_;
                auVar65._24_4_ = fStack_28a8 * auVar40._24_4_;
                auVar82 = auVar65._0_32_;
                uVar32 = *(undefined4 *)((root.ptr - 0x30) + lVar29 * 4);
                auVar60._4_4_ = uVar32;
                auVar60._0_4_ = uVar32;
                auVar60._8_4_ = uVar32;
                auVar60._12_4_ = uVar32;
                auVar60._16_4_ = uVar32;
                auVar60._20_4_ = uVar32;
                auVar60._24_4_ = uVar32;
                auVar60._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar60,auVar19);
                auVar87._0_4_ = local_28a0._0_4_ * auVar40._0_4_;
                auVar87._4_4_ = local_28a0._4_4_ * auVar40._4_4_;
                auVar87._8_4_ = local_28a0._8_4_ * auVar40._8_4_;
                auVar87._12_4_ = local_28a0._12_4_ * auVar40._12_4_;
                auVar87._16_4_ = local_28a0._16_4_ * auVar40._16_4_;
                auVar87._20_4_ = local_28a0._20_4_ * auVar40._20_4_;
                auVar87._24_4_ = local_28a0._24_4_ * auVar40._24_4_;
                auVar39 = auVar87._0_32_;
                uVar32 = *(undefined4 *)((root.ptr - 0x10) + lVar29 * 4);
                auVar61._4_4_ = uVar32;
                auVar61._0_4_ = uVar32;
                auVar61._8_4_ = uVar32;
                auVar61._12_4_ = uVar32;
                auVar61._16_4_ = uVar32;
                auVar61._20_4_ = uVar32;
                auVar61._24_4_ = uVar32;
                auVar61._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar61,auVar21);
                auVar92._0_4_ = local_2880._0_4_ * auVar40._0_4_;
                auVar92._4_4_ = local_2880._4_4_ * auVar40._4_4_;
                auVar92._8_4_ = local_2880._8_4_ * auVar40._8_4_;
                auVar92._12_4_ = local_2880._12_4_ * auVar40._12_4_;
                auVar92._16_4_ = local_2880._16_4_ * auVar40._16_4_;
                auVar92._20_4_ = local_2880._20_4_ * auVar40._20_4_;
                auVar92._24_4_ = local_2880._24_4_ * auVar40._24_4_;
                auVar48 = auVar92._0_32_;
                uVar32 = *(undefined4 *)((root.ptr - 0x40) + lVar29 * 4);
                auVar62._4_4_ = uVar32;
                auVar62._0_4_ = uVar32;
                auVar62._8_4_ = uVar32;
                auVar62._12_4_ = uVar32;
                auVar62._16_4_ = uVar32;
                auVar62._20_4_ = uVar32;
                auVar62._24_4_ = uVar32;
                auVar62._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar62,auVar17);
                uVar32 = *(undefined4 *)((root.ptr - 0x20) + lVar29 * 4);
                auVar72._4_4_ = uVar32;
                auVar72._0_4_ = uVar32;
                auVar72._8_4_ = uVar32;
                auVar72._12_4_ = uVar32;
                auVar72._16_4_ = uVar32;
                auVar72._20_4_ = uVar32;
                auVar72._24_4_ = uVar32;
                auVar72._28_4_ = uVar32;
                auVar13._4_4_ = (float)local_28c0._4_4_ * auVar40._4_4_;
                auVar13._0_4_ = (float)local_28c0._0_4_ * auVar40._0_4_;
                auVar13._8_4_ = fStack_28b8 * auVar40._8_4_;
                auVar13._12_4_ = fStack_28b4 * auVar40._12_4_;
                auVar13._16_4_ = fStack_28b0 * auVar40._16_4_;
                auVar13._20_4_ = fStack_28ac * auVar40._20_4_;
                auVar13._24_4_ = fStack_28a8 * auVar40._24_4_;
                auVar13._28_4_ = uStack_28a4;
                auVar40 = vsubps_avx(auVar72,auVar19);
                auVar14._4_4_ = local_28a0._4_4_ * auVar40._4_4_;
                auVar14._0_4_ = local_28a0._0_4_ * auVar40._0_4_;
                auVar14._8_4_ = local_28a0._8_4_ * auVar40._8_4_;
                auVar14._12_4_ = local_28a0._12_4_ * auVar40._12_4_;
                auVar14._16_4_ = local_28a0._16_4_ * auVar40._16_4_;
                auVar14._20_4_ = local_28a0._20_4_ * auVar40._20_4_;
                auVar14._24_4_ = local_28a0._24_4_ * auVar40._24_4_;
                auVar14._28_4_ = uVar32;
                uVar32 = *(undefined4 *)(root.ptr + lVar29 * 4);
                auVar63._4_4_ = uVar32;
                auVar63._0_4_ = uVar32;
                auVar63._8_4_ = uVar32;
                auVar63._12_4_ = uVar32;
                auVar63._16_4_ = uVar32;
                auVar63._20_4_ = uVar32;
                auVar63._24_4_ = uVar32;
                auVar63._28_4_ = uVar32;
                auVar40 = vsubps_avx(auVar63,auVar21);
                auVar15._4_4_ = local_2880._4_4_ * auVar40._4_4_;
                auVar15._0_4_ = local_2880._0_4_ * auVar40._0_4_;
                auVar15._8_4_ = local_2880._8_4_ * auVar40._8_4_;
                auVar15._12_4_ = local_2880._12_4_ * auVar40._12_4_;
                auVar15._16_4_ = local_2880._16_4_ * auVar40._16_4_;
                auVar15._20_4_ = local_2880._20_4_ * auVar40._20_4_;
                auVar15._24_4_ = local_2880._24_4_ * auVar40._24_4_;
                auVar15._28_4_ = (int)((ulong)local_2980._56_8_ >> 0x20);
                auVar40 = vminps_avx(auVar82,auVar13);
                auVar41 = vminps_avx(auVar39,auVar14);
                auVar40 = vmaxps_avx(auVar40,auVar41);
                auVar41 = vminps_avx(auVar48,auVar15);
                auVar40 = vmaxps_avx(auVar40,auVar41);
                auVar42 = vmulps_avx512vl(auVar40,auVar103._0_32_);
                auVar40 = vmaxps_avx(auVar82,auVar13);
                auVar41 = vmaxps_avx(auVar39,auVar14);
                auVar41 = vminps_avx(auVar40,auVar41);
                auVar40 = vmaxps_avx(auVar48,auVar15);
                auVar40 = vminps_avx(auVar41,auVar40);
                auVar41 = vmulps_avx512vl(auVar40,auVar104._0_32_);
                auVar22._4_4_ = uStack_27fc;
                auVar22._0_4_ = local_2800;
                auVar22._8_4_ = uStack_27f8;
                auVar22._12_4_ = uStack_27f4;
                auVar22._16_4_ = uStack_27f0;
                auVar22._20_4_ = uStack_27ec;
                auVar22._24_4_ = uStack_27e8;
                auVar22._28_4_ = uStack_27e4;
                auVar40 = vmaxps_avx(auVar42,auVar22);
                auVar41 = vminps_avx(auVar41,local_27e0);
                auVar47 = local_2880;
              }
              else {
                uVar32 = *(undefined4 *)((uVar27 - 0x50) + lVar29 * 4);
                auVar74._4_4_ = uVar32;
                auVar74._0_4_ = uVar32;
                auVar74._8_4_ = uVar32;
                auVar74._12_4_ = uVar32;
                auVar74._16_4_ = uVar32;
                auVar74._20_4_ = uVar32;
                auVar74._24_4_ = uVar32;
                auVar74._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar27 - 0x40) + lVar29 * 4);
                auVar73._4_4_ = uVar32;
                auVar73._0_4_ = uVar32;
                auVar73._8_4_ = uVar32;
                auVar73._12_4_ = uVar32;
                auVar73._16_4_ = uVar32;
                auVar73._20_4_ = uVar32;
                auVar73._24_4_ = uVar32;
                auVar73._28_4_ = uVar32;
                fVar78 = *(float *)((uVar27 - 0x30) + lVar29 * 4);
                auVar64._4_4_ = fVar78;
                auVar64._0_4_ = fVar78;
                auVar64._8_4_ = fVar78;
                auVar64._12_4_ = fVar78;
                auVar64._16_4_ = fVar78;
                auVar64._20_4_ = fVar78;
                auVar64._24_4_ = fVar78;
                auVar64._28_4_ = fVar78;
                uVar32 = *(undefined4 *)((uVar27 - 0x20) + lVar29 * 4);
                auVar98._4_4_ = uVar32;
                auVar98._0_4_ = uVar32;
                auVar98._8_4_ = uVar32;
                auVar98._12_4_ = uVar32;
                auVar98._16_4_ = uVar32;
                auVar98._20_4_ = uVar32;
                auVar98._24_4_ = uVar32;
                auVar98._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar27 - 0x10) + lVar29 * 4);
                auVar95._4_4_ = uVar32;
                auVar95._0_4_ = uVar32;
                auVar95._8_4_ = uVar32;
                auVar95._12_4_ = uVar32;
                auVar95._16_4_ = uVar32;
                auVar95._20_4_ = uVar32;
                auVar95._24_4_ = uVar32;
                auVar95._28_4_ = uVar32;
                uVar32 = *(undefined4 *)(uVar27 + lVar29 * 4);
                auVar86._4_4_ = uVar32;
                auVar86._0_4_ = uVar32;
                auVar86._8_4_ = uVar32;
                auVar86._12_4_ = uVar32;
                auVar86._16_4_ = uVar32;
                auVar86._20_4_ = uVar32;
                auVar86._24_4_ = uVar32;
                auVar86._28_4_ = uVar32;
                fVar58 = *(float *)(uVar27 + 0x10 + lVar29 * 4);
                auVar85._4_4_ = fVar58;
                auVar85._0_4_ = fVar58;
                auVar85._8_4_ = fVar58;
                auVar85._12_4_ = fVar58;
                auVar85._16_4_ = fVar58;
                auVar85._20_4_ = fVar58;
                auVar85._24_4_ = fVar58;
                auVar85._28_4_ = fVar58;
                fVar66 = *(float *)(uVar27 + 0x20 + lVar29 * 4);
                auVar83._4_4_ = fVar66;
                auVar83._0_4_ = fVar66;
                auVar83._8_4_ = fVar66;
                auVar83._12_4_ = fVar66;
                auVar83._16_4_ = fVar66;
                auVar83._20_4_ = fVar66;
                auVar83._24_4_ = fVar66;
                auVar83._28_4_ = fVar66;
                fVar67 = *(float *)(uVar27 + 0x30 + lVar29 * 4);
                auVar76._4_4_ = fVar67;
                auVar76._0_4_ = fVar67;
                auVar76._8_4_ = fVar67;
                auVar76._12_4_ = fVar67;
                auVar76._16_4_ = fVar67;
                auVar76._20_4_ = fVar67;
                auVar76._24_4_ = fVar67;
                auVar76._28_4_ = fVar67;
                auVar18._8_8_ = local_2980._8_8_;
                auVar18._0_8_ = local_2980._0_8_;
                auVar18._16_8_ = local_2980._16_8_;
                auVar18._24_8_ = local_2980._24_8_;
                auVar20._8_8_ = local_2980._40_8_;
                auVar20._0_8_ = local_2980._32_8_;
                auVar20._16_8_ = local_2980._48_8_;
                auVar20._24_8_ = local_2980._56_8_;
                auVar50._8_8_ = local_2980._72_8_;
                auVar50._0_8_ = local_2980._64_8_;
                auVar50._16_8_ = local_2980._80_8_;
                auVar50._24_8_ = local_2980._88_8_;
                auVar91._0_4_ = (float)local_28e0._0_4_ * fVar58;
                auVar91._4_4_ = (float)local_28e0._4_4_ * fVar58;
                auVar91._8_4_ = fStack_28d8 * fVar58;
                auVar91._12_4_ = fStack_28d4 * fVar58;
                auVar91._16_4_ = fStack_28d0 * fVar58;
                auVar91._20_4_ = fStack_28cc * fVar58;
                auVar91._28_36_ = auVar90._28_36_;
                auVar91._24_4_ = fStack_28c8 * fVar58;
                auVar90._0_4_ = (float)local_28e0._0_4_ * fVar66;
                auVar90._4_4_ = (float)local_28e0._4_4_ * fVar66;
                auVar90._8_4_ = fStack_28d8 * fVar66;
                auVar90._12_4_ = fStack_28d4 * fVar66;
                auVar90._16_4_ = fStack_28d0 * fVar66;
                auVar90._20_4_ = fStack_28cc * fVar66;
                auVar90._24_4_ = fStack_28c8 * fVar66;
                auVar90._28_36_ = auVar92._28_36_;
                auVar47._4_4_ = (float)local_28e0._4_4_ * fVar67;
                auVar47._0_4_ = (float)local_28e0._0_4_ * fVar67;
                auVar47._8_4_ = fStack_28d8 * fVar67;
                auVar47._12_4_ = fStack_28d4 * fVar67;
                auVar47._16_4_ = fStack_28d0 * fVar67;
                auVar47._20_4_ = fStack_28cc * fVar67;
                auVar47._24_4_ = fStack_28c8 * fVar67;
                auVar47._28_4_ = uStack_28c4;
                auVar40 = vfmadd231ps_avx512vl(auVar91._0_32_,local_2900,auVar98);
                auVar41 = vfmadd231ps_avx512vl(auVar90._0_32_,local_2900,auVar95);
                auVar42 = vfmadd231ps_avx512vl(auVar47,auVar86,local_2900);
                auVar40 = vfmadd231ps_avx512vl(auVar40,local_2920,auVar74);
                auVar41 = vfmadd231ps_avx512vl(auVar41,local_2920,auVar73);
                auVar42 = vfmadd231ps_avx512vl(auVar42,auVar64,local_2920);
                auVar39 = auVar99._0_32_;
                vandps_avx512vl(auVar40,auVar39);
                auVar43 = auVar100._0_32_;
                uVar12 = vcmpps_avx512vl(auVar42,auVar43,1);
                bVar26 = (bool)((byte)uVar12 & 1);
                iVar36 = auVar100._0_4_;
                auVar48._0_4_ = (uint)bVar26 * iVar36 | (uint)!bVar26 * auVar40._0_4_;
                bVar26 = (bool)((byte)(uVar12 >> 1) & 1);
                iVar51 = auVar100._4_4_;
                auVar48._4_4_ = (uint)bVar26 * iVar51 | (uint)!bVar26 * auVar40._4_4_;
                bVar26 = (bool)((byte)(uVar12 >> 2) & 1);
                iVar52 = auVar100._8_4_;
                auVar48._8_4_ = (uint)bVar26 * iVar52 | (uint)!bVar26 * auVar40._8_4_;
                bVar26 = (bool)((byte)(uVar12 >> 3) & 1);
                iVar53 = auVar100._12_4_;
                auVar48._12_4_ = (uint)bVar26 * iVar53 | (uint)!bVar26 * auVar40._12_4_;
                bVar26 = (bool)((byte)(uVar12 >> 4) & 1);
                iVar54 = auVar100._16_4_;
                auVar48._16_4_ = (uint)bVar26 * iVar54 | (uint)!bVar26 * auVar40._16_4_;
                bVar26 = (bool)((byte)(uVar12 >> 5) & 1);
                iVar55 = auVar100._20_4_;
                auVar48._20_4_ = (uint)bVar26 * iVar55 | (uint)!bVar26 * auVar40._20_4_;
                bVar26 = (bool)((byte)(uVar12 >> 6) & 1);
                iVar56 = auVar100._24_4_;
                iVar57 = auVar100._28_4_;
                auVar48._24_4_ = (uint)bVar26 * iVar56 | (uint)!bVar26 * auVar40._24_4_;
                bVar26 = SUB81(uVar12 >> 7,0);
                auVar48._28_4_ = (uint)bVar26 * iVar57 | (uint)!bVar26 * auVar40._28_4_;
                vandps_avx512vl(auVar41,auVar39);
                uVar12 = vcmpps_avx512vl(auVar48,auVar43,1);
                bVar26 = (bool)((byte)uVar12 & 1);
                auVar45._0_4_ = (uint)bVar26 * iVar36 | (uint)!bVar26 * auVar41._0_4_;
                bVar26 = (bool)((byte)(uVar12 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar26 * iVar51 | (uint)!bVar26 * auVar41._4_4_;
                bVar26 = (bool)((byte)(uVar12 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar26 * iVar52 | (uint)!bVar26 * auVar41._8_4_;
                bVar26 = (bool)((byte)(uVar12 >> 3) & 1);
                auVar45._12_4_ = (uint)bVar26 * iVar53 | (uint)!bVar26 * auVar41._12_4_;
                bVar26 = (bool)((byte)(uVar12 >> 4) & 1);
                auVar45._16_4_ = (uint)bVar26 * iVar54 | (uint)!bVar26 * auVar41._16_4_;
                bVar26 = (bool)((byte)(uVar12 >> 5) & 1);
                auVar45._20_4_ = (uint)bVar26 * iVar55 | (uint)!bVar26 * auVar41._20_4_;
                bVar26 = (bool)((byte)(uVar12 >> 6) & 1);
                auVar45._24_4_ = (uint)bVar26 * iVar56 | (uint)!bVar26 * auVar41._24_4_;
                bVar26 = SUB81(uVar12 >> 7,0);
                auVar45._28_4_ = (uint)bVar26 * iVar57 | (uint)!bVar26 * auVar41._28_4_;
                vandps_avx512vl(auVar42,auVar39);
                uVar12 = vcmpps_avx512vl(auVar45,auVar43,1);
                bVar26 = (bool)((byte)uVar12 & 1);
                auVar46._0_4_ = (uint)bVar26 * iVar36 | (uint)!bVar26 * auVar42._0_4_;
                bVar26 = (bool)((byte)(uVar12 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar26 * iVar51 | (uint)!bVar26 * auVar42._4_4_;
                bVar26 = (bool)((byte)(uVar12 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar26 * iVar52 | (uint)!bVar26 * auVar42._8_4_;
                bVar26 = (bool)((byte)(uVar12 >> 3) & 1);
                auVar46._12_4_ = (uint)bVar26 * iVar53 | (uint)!bVar26 * auVar42._12_4_;
                bVar26 = (bool)((byte)(uVar12 >> 4) & 1);
                auVar46._16_4_ = (uint)bVar26 * iVar54 | (uint)!bVar26 * auVar42._16_4_;
                bVar26 = (bool)((byte)(uVar12 >> 5) & 1);
                auVar46._20_4_ = (uint)bVar26 * iVar55 | (uint)!bVar26 * auVar42._20_4_;
                bVar26 = (bool)((byte)(uVar12 >> 6) & 1);
                auVar46._24_4_ = (uint)bVar26 * iVar56 | (uint)!bVar26 * auVar42._24_4_;
                bVar26 = SUB81(uVar12 >> 7,0);
                auVar46._28_4_ = (uint)bVar26 * iVar57 | (uint)!bVar26 * auVar42._28_4_;
                auVar40 = vrcp14ps_avx512vl(auVar48);
                auVar42 = auVar101._0_32_;
                auVar41 = vfnmadd213ps_avx512vl(auVar48,auVar40,auVar42);
                auVar47 = vfmadd132ps_avx512vl(auVar41,auVar40,auVar40);
                auVar40 = vrcp14ps_avx512vl(auVar45);
                auVar41 = vfnmadd213ps_avx512vl(auVar45,auVar40,auVar42);
                auVar48 = vfmadd132ps_avx512vl(auVar41,auVar40,auVar40);
                auVar40 = vrcp14ps_avx512vl(auVar46);
                auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar42);
                auVar40 = vfmadd132ps_avx512vl(auVar41,auVar40,auVar40);
                auVar105 = auVar106._0_32_;
                auVar41 = vxorps_avx512vl(auVar47,auVar105);
                auVar42 = vxorps_avx512vl(auVar48,auVar105);
                uVar32 = *(undefined4 *)(uVar27 + 0x40 + lVar29 * 4);
                auVar39._4_4_ = uVar32;
                auVar39._0_4_ = uVar32;
                auVar39._8_4_ = uVar32;
                auVar39._12_4_ = uVar32;
                auVar39._16_4_ = uVar32;
                auVar39._20_4_ = uVar32;
                auVar39._24_4_ = uVar32;
                auVar39._28_4_ = uVar32;
                auVar39 = vfmadd213ps_avx512vl(auVar85,auVar50,auVar39);
                uVar32 = *(undefined4 *)(uVar27 + 0x50 + lVar29 * 4);
                auVar43._4_4_ = uVar32;
                auVar43._0_4_ = uVar32;
                auVar43._8_4_ = uVar32;
                auVar43._12_4_ = uVar32;
                auVar43._16_4_ = uVar32;
                auVar43._20_4_ = uVar32;
                auVar43._24_4_ = uVar32;
                auVar43._28_4_ = uVar32;
                auVar43 = vfmadd213ps_avx512vl(auVar83,auVar50,auVar43);
                uVar32 = *(undefined4 *)(uVar27 + 0x60 + lVar29 * 4);
                auVar49._4_4_ = uVar32;
                auVar49._0_4_ = uVar32;
                auVar49._8_4_ = uVar32;
                auVar49._12_4_ = uVar32;
                auVar49._16_4_ = uVar32;
                auVar49._20_4_ = uVar32;
                auVar49._24_4_ = uVar32;
                auVar49._28_4_ = uVar32;
                auVar49 = vfmadd213ps_avx512vl(auVar76,auVar50,auVar49);
                auVar50 = vxorps_avx512vl(auVar40,auVar105);
                auVar81 = vfmadd231ps_fma(auVar39,auVar20,auVar98);
                auVar79 = vfmadd231ps_fma(auVar43,auVar20,auVar95);
                auVar75 = vfmadd231ps_fma(auVar49,auVar20,auVar86);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar18,auVar74);
                auVar43 = vmulps_avx512vl(ZEXT1632(auVar81),auVar41);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar18,auVar73);
                auVar42 = vmulps_avx512vl(ZEXT1632(auVar81),auVar42);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar18,auVar64);
                fVar58 = auVar50._0_4_ * auVar81._0_4_;
                fVar66 = auVar50._4_4_ * auVar81._4_4_;
                auVar105._4_4_ = fVar66;
                auVar105._0_4_ = fVar58;
                fVar67 = auVar50._8_4_ * auVar81._8_4_;
                auVar105._8_4_ = fVar67;
                fVar68 = auVar50._12_4_ * auVar81._12_4_;
                auVar105._12_4_ = fVar68;
                fVar69 = auVar50._16_4_ * 0.0;
                auVar105._16_4_ = fVar69;
                fVar70 = auVar50._20_4_ * 0.0;
                auVar105._20_4_ = fVar70;
                fVar71 = auVar50._24_4_ * 0.0;
                auVar105._24_4_ = fVar71;
                auVar105._28_4_ = fVar78;
                auVar77._0_4_ = auVar47._0_4_ + auVar43._0_4_;
                auVar77._4_4_ = auVar47._4_4_ + auVar43._4_4_;
                auVar77._8_4_ = auVar47._8_4_ + auVar43._8_4_;
                auVar77._12_4_ = auVar47._12_4_ + auVar43._12_4_;
                auVar77._16_4_ = auVar47._16_4_ + auVar43._16_4_;
                auVar77._20_4_ = auVar47._20_4_ + auVar43._20_4_;
                auVar77._24_4_ = auVar47._24_4_ + auVar43._24_4_;
                auVar77._28_4_ = auVar47._28_4_ + auVar43._28_4_;
                auVar80._0_4_ = auVar48._0_4_ + auVar42._0_4_;
                auVar80._4_4_ = auVar48._4_4_ + auVar42._4_4_;
                auVar80._8_4_ = auVar48._8_4_ + auVar42._8_4_;
                auVar80._12_4_ = auVar48._12_4_ + auVar42._12_4_;
                auVar80._16_4_ = auVar48._16_4_ + auVar42._16_4_;
                auVar80._20_4_ = auVar48._20_4_ + auVar42._20_4_;
                auVar80._24_4_ = auVar48._24_4_ + auVar42._24_4_;
                auVar80._28_4_ = auVar48._28_4_ + auVar42._28_4_;
                auVar82._0_4_ = auVar40._0_4_ + fVar58;
                auVar82._4_4_ = auVar40._4_4_ + fVar66;
                auVar82._8_4_ = auVar40._8_4_ + fVar67;
                auVar82._12_4_ = auVar40._12_4_ + fVar68;
                auVar82._16_4_ = auVar40._16_4_ + fVar69;
                auVar82._20_4_ = auVar40._20_4_ + fVar70;
                auVar82._24_4_ = auVar40._24_4_ + fVar71;
                auVar82._28_4_ = auVar40._28_4_ + fVar78;
                auVar40 = vpminsd_avx2(auVar43,auVar77);
                auVar41 = vpminsd_avx2(auVar42,auVar80);
                auVar40 = vpmaxsd_avx2(auVar40,auVar41);
                auVar39 = vpminsd_avx2(auVar105,auVar82);
                auVar40 = vpmaxsd_avx2(auVar40,auVar39);
                auVar41 = vpmaxsd_avx2(auVar43,auVar77);
                auVar42 = vpmaxsd_avx2(auVar42,auVar80);
                auVar42 = vpminsd_avx2(auVar41,auVar42);
                auVar41 = vpmaxsd_avx2(auVar105,auVar82);
                auVar41 = vpminsd_avx2(auVar42,auVar41);
                auVar42 = vmulps_avx512vl(auVar40,auVar103._0_32_);
                auVar41 = vmulps_avx512vl(auVar41,auVar104._0_32_);
                auVar23._4_4_ = uStack_27fc;
                auVar23._0_4_ = local_2800;
                auVar23._8_4_ = uStack_27f8;
                auVar23._12_4_ = uStack_27f4;
                auVar23._16_4_ = uStack_27f0;
                auVar23._20_4_ = uStack_27ec;
                auVar23._24_4_ = uStack_27e8;
                auVar23._28_4_ = uStack_27e4;
                auVar40 = vpmaxsd_avx2(auVar42,auVar23);
                auVar41 = vpminsd_avx2(auVar41,local_27e0);
              }
              auVar92 = ZEXT3264(auVar48);
              auVar90 = ZEXT3264(auVar47);
              auVar87 = ZEXT3264(auVar39);
              auVar84 = ZEXT3264(auVar82);
              uVar12 = vcmpps_avx512vl(auVar40,auVar41,2);
              if ((byte)uVar12 == 0) {
                auVar65 = ZEXT3264(auVar44);
                uVar35 = uVar34;
              }
              else {
                auVar40 = vblendmps_avx512vl(auVar102._0_32_,auVar42);
                bVar26 = (bool)((byte)uVar12 & 1);
                bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
                bVar10 = SUB81(uVar12 >> 7,0);
                auVar65 = ZEXT3264(CONCAT428((uint)bVar10 * auVar40._28_4_ |
                                             (uint)!bVar10 * auVar42._28_4_,
                                             CONCAT424((uint)bVar9 * auVar40._24_4_ |
                                                       (uint)!bVar9 * auVar42._24_4_,
                                                       CONCAT420((uint)bVar8 * auVar40._20_4_ |
                                                                 (uint)!bVar8 * auVar42._20_4_,
                                                                 CONCAT416((uint)bVar7 *
                                                                           auVar40._16_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar42._16_4_,
                                                                           CONCAT412((uint)bVar6 *
                                                                                     auVar40._12_4_
                                                                                     | (uint)!bVar6
                                                                                       * auVar42.
                                                  _12_4_,CONCAT48((uint)bVar5 * auVar40._8_4_ |
                                                                  (uint)!bVar5 * auVar42._8_4_,
                                                                  CONCAT44((uint)bVar4 *
                                                                           auVar40._4_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar42._4_4_,
                                                                           (uint)bVar26 *
                                                                           auVar40._0_4_ |
                                                                           (uint)!bVar26 *
                                                                           auVar42._0_4_))))))));
                if (uVar34 != 8) {
                  *puVar28 = uVar34;
                  puVar28 = puVar28 + 1;
                  *pauVar31 = auVar44;
                  pauVar31 = pauVar31 + 1;
                }
              }
              uVar34 = uVar35;
              lVar29 = lVar29 + 1;
              auVar44 = auVar65._0_32_;
            } while (lVar29 != 0x20);
            if (uVar34 == 8) goto LAB_0070ea04;
            uVar11 = vcmpps_avx512vl(auVar65._0_32_,local_27e0,9);
            root.ptr = uVar34;
          } while ((byte)uVar30 < (byte)POPCOUNT((int)uVar11));
          *puVar28 = uVar34;
          puVar28 = puVar28 + 1;
          *pauVar31 = auVar65._0_32_;
          pauVar31 = pauVar31 + 1;
LAB_0070ea04:
          iVar36 = 4;
        }
        else {
          do {
            sVar2 = 0;
            for (uVar27 = uVar34; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            auVar84 = ZEXT1664(auVar84._0_16_);
            auVar87 = ZEXT1664(auVar87._0_16_);
            auVar90 = ZEXT1664(auVar90._0_16_);
            auVar92 = ZEXT1664(auVar92._0_16_);
            bVar26 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_true> *)&local_2980.field_0,context);
            bVar25 = (byte)(1 << ((uint)sVar2 & 0x1f));
            if (!bVar26) {
              bVar25 = 0;
            }
            local_29e4 = local_29e4 | bVar25;
            uVar34 = uVar34 - 1 & uVar34;
          } while (uVar34 != 0);
          iVar36 = 3;
          if (local_29e4 != 0xff) {
            auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar26 = (bool)(local_29e4 >> 1 & 1);
            bVar4 = (bool)(local_29e4 >> 2 & 1);
            bVar5 = (bool)(local_29e4 >> 3 & 1);
            bVar6 = (bool)(local_29e4 >> 4 & 1);
            bVar7 = (bool)(local_29e4 >> 5 & 1);
            bVar8 = (bool)(local_29e4 >> 6 & 1);
            local_27e0._4_4_ = (uint)bVar26 * auVar40._4_4_ | (uint)!bVar26 * local_27e0._4_4_;
            local_27e0._0_4_ =
                 (uint)(local_29e4 & 1) * auVar40._0_4_ |
                 (uint)!(bool)(local_29e4 & 1) * local_27e0._0_4_;
            local_27e0._8_4_ = (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
            local_27e0._12_4_ = (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
            local_27e0._16_4_ = (uint)bVar6 * auVar40._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
            local_27e0._20_4_ = (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
            local_27e0._24_4_ = (uint)bVar8 * auVar40._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
            local_27e0._28_4_ =
                 (uint)(local_29e4 >> 7) * auVar40._28_4_ |
                 (uint)!(bool)(local_29e4 >> 7) * local_27e0._28_4_;
            iVar36 = 2;
          }
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar99 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar100 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar101 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar102 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar103 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar104 = ZEXT3264(auVar40);
          auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar106 = ZEXT3264(auVar40);
          auVar65 = ZEXT3264(auVar44);
          if (uVar30 < (uint)POPCOUNT(uVar32)) goto LAB_0070e6a0;
        }
      } while (iVar36 != 3);
LAB_0070ec6b:
      local_29e4 = local_29e4 & bVar33;
      bVar26 = (bool)(local_29e4 >> 1 & 1);
      bVar4 = (bool)(local_29e4 >> 2 & 1);
      bVar5 = (bool)(local_29e4 >> 3 & 1);
      bVar6 = (bool)(local_29e4 >> 4 & 1);
      bVar7 = (bool)(local_29e4 >> 5 & 1);
      bVar8 = (bool)(local_29e4 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(local_29e4 & 1) * -0x800000 |
           (uint)!(bool)(local_29e4 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar26 * -0x800000 | (uint)!bVar26 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(local_29e4 >> 7) * -0x800000 |
           (uint)!(bool)(local_29e4 >> 7) * *(int *)(ray + 0x11c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }